

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::NodeLoader::begin__instance_node
          (NodeLoader *this,instance_node__AttributeData *attributeData)

{
  reference ppNVar1;
  FilePartLoader *__a;
  char *__s;
  UniqueId *pUVar2;
  void *pvVar3;
  InstanceNodePointerArray *this_00;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  bool in_stack_0000002b;
  ClassId in_stack_0000002c;
  URI *in_stack_00000030;
  IFilePartLoader *in_stack_00000038;
  InstanceNode *instanceNode;
  UniqueId instanceNodeUniqueId;
  UniqueId instantiatedNodeUniqueId;
  Node *currentNode;
  String *in_stack_ffffffffffffff18;
  InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)442> *in_stack_ffffffffffffff20;
  UniqueId *in_stack_ffffffffffffff28;
  InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)442> *in_stack_ffffffffffffff30;
  allocator<char> local_89;
  string local_88 [32];
  void *local_68;
  UniqueId local_50;
  UniqueId local_38;
  value_type local_18;
  long local_10;
  
  local_10 = in_RSI;
  ppNVar1 = std::
            stack<COLLADAFW::Node_*,_std::deque<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>_>
            ::top((stack<COLLADAFW::Node_*,_std::deque<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>_>
                   *)0xc4377d);
  local_18 = *ppNVar1;
  __a = HelperLoaderBase::getHandlingFilePartLoader((HelperLoaderBase *)in_RDI);
  __s = (char *)(local_10 + 0xf0);
  COLLADAFW::ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)424>::ID();
  pUVar2 = IFilePartLoader::createUniqueIdFromUrl
                     (in_stack_00000038,in_stack_00000030,in_stack_0000002c,in_stack_0000002b);
  local_38.mFileId = pUVar2->mFileId;
  local_38.mClassId = pUVar2->mClassId;
  local_38._4_4_ = *(undefined4 *)&pUVar2->field_0x4;
  local_38.mObjectId = pUVar2->mObjectId;
  HelperLoaderBase::getHandlingFilePartLoader((HelperLoaderBase *)in_RDI);
  COLLADAFW::ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)442>::ID();
  IFilePartLoader::createUniqueId
            ((IFilePartLoader *)in_stack_ffffffffffffff28,
             (ClassId)((ulong)in_stack_ffffffffffffff20 >> 0x20));
  pvVar3 = operator_new(0x58);
  COLLADAFW::InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)442>::InstanceBase
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             (UniqueId *)in_stack_ffffffffffffff20);
  local_68 = pvVar3;
  if (*(long *)(local_10 + 0x1e0) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_RDI,__s,(allocator<char> *)__a);
    COLLADAFW::InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)442>::setName
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator(&local_89);
  }
  this_00 = COLLADAFW::Node::getInstanceNodes(local_18);
  COLLADAFW::ArrayPrimitiveType<COLLADAFW::InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)442>_*>::
  append((ArrayPrimitiveType<COLLADAFW::InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)442>_*> *)
         this_00,(InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)442> **)in_stack_ffffffffffffff18);
  COLLADAFW::UniqueId::~UniqueId(&local_50);
  COLLADAFW::UniqueId::~UniqueId(&local_38);
  return true;
}

Assistant:

bool NodeLoader::begin__instance_node( const instance_node__AttributeData& attributeData )
	{
		COLLADAFW::Node* currentNode = mNodeStack.top();
		COLLADAFW::UniqueId instantiatedNodeUniqueId = getHandlingFilePartLoader()->createUniqueIdFromUrl( attributeData.url, COLLADAFW::Node::ID() );

        COLLADAFW::UniqueId instanceNodeUniqueId = getHandlingFilePartLoader()->createUniqueId( COLLADAFW::InstanceNode::ID() );
		COLLADAFW::InstanceNode* instanceNode = FW_NEW COLLADAFW::InstanceNode(instanceNodeUniqueId,instantiatedNodeUniqueId);
		if( attributeData.name )
			instanceNode->setName( attributeData.name );
		currentNode->getInstanceNodes().append(instanceNode);

		return true;
	}